

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void string8_suite::test_two(void)

{
  decoder *decoder_00;
  value_type input [4];
  decoder decoder;
  undefined4 local_78;
  uchar local_74 [4];
  return_type local_70;
  decoder local_50;
  
  local_74[0] = 0xa9;
  local_74[1] = '\x02';
  local_74[2] = 'A';
  local_74[3] = 'B';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[4]>(&local_50,&local_74);
  local_70._M_dataplus._M_p._0_4_ = local_50.current.code;
  local_78 = 0xa9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::string8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x431,"void string8_suite::test_two()",&local_70,&local_78);
  trial::protocol::bintoken::detail::decoder::overloader<trial::protocol::bintoken::token::string>::
  decode_abi_cxx11_(&local_70,(overloader<trial::protocol::bintoken::token::string> *)&local_50,
                    decoder_00);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("decoder.value<token::string>()","\"AB\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x432,"void string8_suite::test_two()",&local_70,"AB");
  std::__cxx11::string::~string((string *)&local_70);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_70._M_dataplus._M_p._0_4_ = local_50.current.code;
  local_78 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x434,"void string8_suite::test_two()",&local_70,&local_78);
  return;
}

Assistant:

void test_two()
{
    const value_type input[] = { token::code::string8, 0x02, 0x41, 0x42 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::string>(), "AB");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}